

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

bool __thiscall FSerializer::BeginArray(FSerializer *this,char *name)

{
  uint uVar1;
  FWriter *pFVar2;
  FReader *this_00;
  FJSONObject *pFVar3;
  bool bVar4;
  Value *pVVar5;
  
  if (this->w == (FWriter *)0x0) {
    pVVar5 = FReader::FindKey(this->r,name);
    if (pVVar5 != (Value *)0x0) {
      if ((pVVar5->data_).f.flags != 4) {
        __assert_fail("val->IsArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x28b,"bool FSerializer::BeginArray(const char *)");
      }
      this_00 = this->r;
      TArray<FJSONObject,_FJSONObject>::Grow(&this_00->mObjects,1);
      uVar1 = (this_00->mObjects).Count;
      pFVar3 = (this_00->mObjects).Array;
      pFVar3[uVar1].mObject = pVVar5;
      pFVar3[uVar1].mIterator.ptr_ = (Pointer)0x0;
      pFVar3[uVar1].mIndex = 0;
      (this_00->mObjects).Count = uVar1 + 1;
      if (pVVar5 != (Value *)0x0) goto LAB_0047a03f;
    }
    bVar4 = false;
  }
  else {
    WriteKey(this,name);
    FWriter::StartArray(this->w);
    pFVar2 = this->w;
    TArray<bool,_bool>::Grow(&pFVar2->mInObject,1);
    uVar1 = (pFVar2->mInObject).Count;
    (pFVar2->mInObject).Array[uVar1] = false;
    (pFVar2->mInObject).Count = uVar1 + 1;
LAB_0047a03f:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool FSerializer::BeginArray(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartArray();
		w->mInObject.Push(false);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsArray());
			if (val->IsArray())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Array expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}